

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

PyObject * pybind11::detail::make_new_python_type(type_record *rec)

{
  PyTypeObject *pPVar1;
  key_type **pppcVar2;
  handle hVar3;
  int iVar4;
  object *poVar5;
  long *plVar6;
  internals *piVar7;
  _Fwd_list_node_base *p_Var8;
  size_t sVar9;
  void *__dest;
  long lVar10;
  PyObject **ppPVar11;
  PyObject *pPVar12;
  error_already_set *this;
  PyObject *pPVar13;
  size_type *psVar14;
  object *object;
  PyTypeObject *pPVar15;
  PyTypeObject *type;
  tuple bases;
  object module;
  object name;
  object qualname;
  handle local_160;
  handle local_158;
  allocator local_149;
  handle local_148;
  accessor<pybind11::detail::accessor_policies::str_attr> local_140;
  handle local_120;
  object local_118;
  handle local_110;
  long local_108;
  PyObject local_100;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  local_148.m_ptr = (PyObject *)PyUnicode_FromString(rec->name);
  if (local_148.m_ptr != (PyObject *)0x0) {
    (local_148.m_ptr)->ob_refcnt = (local_148.m_ptr)->ob_refcnt + 1;
  }
  pPVar13 = (rec->scope).m_ptr;
  local_120.m_ptr = local_148.m_ptr;
  if ((pPVar13 != (PyObject *)0x0) &&
     (pPVar1 = pPVar13->ob_type, pPVar1 != (PyTypeObject *)&PyModule_Type)) {
    iVar4 = PyType_IsSubtype(pPVar1,&PyModule_Type);
    if (iVar4 == 0) {
      iVar4 = PyObject_HasAttrString((rec->scope).m_ptr,"__qualname__");
      if (iVar4 == 1) {
        local_140.obj.m_ptr = (rec->scope).m_ptr;
        local_140.key = "__qualname__";
        local_140.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
        poVar5 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_140);
        local_110.m_ptr =
             (PyObject *)PyUnicode_FromFormat("%U.%U",(poVar5->super_handle).m_ptr,local_148.m_ptr);
        pybind11::object::operator=((object *)&local_120,(object *)&local_110);
        pybind11::object::~object((object *)&local_110);
        pybind11::object::~object(&local_140.cache);
      }
    }
  }
  local_158.m_ptr = (PyObject *)0x0;
  pPVar13 = (rec->scope).m_ptr;
  if (pPVar13 != (PyObject *)0x0) {
    iVar4 = PyObject_HasAttrString(pPVar13,"__module__");
    if (iVar4 == 1) {
      local_140.obj.m_ptr = (rec->scope).m_ptr;
      local_140.key = "__module__";
      local_140.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      poVar5 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_140);
    }
    else {
      iVar4 = PyObject_HasAttrString((rec->scope).m_ptr,"__name__");
      if (iVar4 != 1) goto LAB_00111230;
      local_140.obj.m_ptr = (rec->scope).m_ptr;
      local_140.key = "__name__";
      local_140.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      poVar5 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_140);
    }
    local_110.m_ptr = (poVar5->super_handle).m_ptr;
    if (local_110.m_ptr != (PyObject *)0x0) {
      (local_110.m_ptr)->ob_refcnt = (local_110.m_ptr)->ob_refcnt + 1;
    }
    pybind11::object::operator=((object *)&local_158,(object *)&local_110);
    pybind11::object::~object((object *)&local_110);
    pybind11::object::~object(&local_140.cache);
  }
LAB_00111230:
  hVar3.m_ptr = local_158.m_ptr;
  if (local_158.m_ptr == (PyObject *)0x0) {
    std::__cxx11::string::string((string *)&local_140,rec->name,(allocator *)&local_110);
  }
  else {
    str::str((str *)&local_118,(object *)&local_158);
    cast<std::__cxx11::string>(&local_90,(pybind11 *)&local_118,object);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_110.m_ptr = &local_100;
    pPVar13 = (PyObject *)(plVar6 + 2);
    if ((PyObject *)*plVar6 == pPVar13) {
      local_100.ob_refcnt = pPVar13->ob_refcnt;
      local_100.ob_type = (PyTypeObject *)plVar6[3];
    }
    else {
      local_100.ob_refcnt = pPVar13->ob_refcnt;
      local_110.m_ptr = (PyObject *)*plVar6;
    }
    local_108 = plVar6[1];
    *plVar6 = (long)pPVar13;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_140._0_8_ = &local_140.key;
    p_Var8 = (_Fwd_list_node_base *)(plVar6 + 2);
    if ((_Fwd_list_node_base *)*plVar6 == p_Var8) {
      local_140.key = (key_type)p_Var8->_M_next;
      local_140.cache.super_handle.m_ptr = (handle)plVar6[3];
    }
    else {
      local_140.key = (key_type)p_Var8->_M_next;
      local_140._0_8_ = (_Fwd_list_node_base *)*plVar6;
    }
    local_140.obj.m_ptr = (PyObject *)plVar6[1];
    *plVar6 = (long)p_Var8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
  }
  piVar7 = get_internals();
  p_Var8 = (_Fwd_list_node_base *)operator_new(0x28);
  p_Var8->_M_next = (_Fwd_list_node_base *)0x0;
  p_Var8[1]._M_next = p_Var8 + 3;
  pppcVar2 = (key_type **)&local_140.key;
  if ((key_type **)local_140._0_8_ == pppcVar2) {
    p_Var8[3]._M_next = (_Fwd_list_node_base *)local_140.key;
    p_Var8[4]._M_next = (_Fwd_list_node_base *)local_140.cache.super_handle.m_ptr;
  }
  else {
    p_Var8[1]._M_next = (_Fwd_list_node_base *)local_140._0_8_;
    p_Var8[3]._M_next = (_Fwd_list_node_base *)local_140.key;
  }
  p_Var8[2]._M_next = (_Fwd_list_node_base *)local_140.obj.m_ptr;
  local_140.obj.m_ptr = (PyObject *)0x0;
  local_140.key = (key_type)((ulong)local_140.key & 0xffffffffffffff00);
  p_Var8->_M_next =
       (piVar7->static_strings).
       super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_head._M_next;
  (piVar7->static_strings).
  super__Fwd_list_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_head._M_next = p_Var8;
  pPVar1 = (PyTypeObject *)p_Var8[1]._M_next;
  local_140._0_8_ = pppcVar2;
  if (hVar3.m_ptr != (PyObject *)0x0) {
    if (local_110.m_ptr != &local_100) {
      operator_delete(local_110.m_ptr,local_100.ob_refcnt + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    pybind11::object::~object(&local_118);
  }
  if ((rec->doc == (char *)0x0) || (options::global_state()::instance != '\x01')) {
    __dest = (void *)0x0;
  }
  else {
    sVar9 = strlen(rec->doc);
    __dest = (void *)PyObject_Malloc(sVar9 + 1);
    memcpy(__dest,rec->doc,sVar9 + 1);
  }
  piVar7 = get_internals();
  tuple::tuple((tuple *)&local_160,&(rec->bases).super_object);
  lVar10 = PyTuple_Size(local_160.m_ptr);
  if (lVar10 == 0) {
    ppPVar11 = &piVar7->instance_base;
  }
  else {
    local_140.obj.m_ptr = local_160.m_ptr;
    local_140.key = (key_type)0x0;
    local_140.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    ppPVar11 = (PyObject **)
               accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                         ((accessor<pybind11::detail::accessor_policies::tuple_item> *)&local_140);
  }
  pPVar13 = *ppPVar11;
  if (lVar10 != 0) {
    pybind11::object::~object(&local_140.cache);
  }
  pPVar15 = (PyTypeObject *)(rec->metaclass).m_ptr;
  if (pPVar15 == (PyTypeObject *)0x0) {
    pPVar15 = piVar7->default_metaclass;
  }
  pPVar12 = (*pPVar15->tp_alloc)(pPVar15,0);
  hVar3.m_ptr = local_148.m_ptr;
  if (pPVar12 == (PyObject *)0x0) {
    std::__cxx11::string::string((string *)&local_b0,rec->name,(allocator *)&local_d0);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_f0._M_dataplus._M_p = (pointer)*plVar6;
    psVar14 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_f0._M_dataplus._M_p == psVar14) {
      local_f0.field_2._M_allocated_capacity = *psVar14;
      local_f0.field_2._8_8_ = plVar6[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar14;
    }
    local_f0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    pybind11_fail(&local_f0);
  }
  local_148.m_ptr = (PyObject *)0x0;
  pPVar12[0x35].ob_refcnt = (Py_ssize_t)hVar3.m_ptr;
  if (local_120.m_ptr != (PyObject *)0x0) {
    (local_120.m_ptr)->ob_refcnt = (local_120.m_ptr)->ob_refcnt + 1;
  }
  pPVar12[0x36].ob_refcnt = (Py_ssize_t)local_120.m_ptr;
  pPVar12[1].ob_type = pPVar1;
  pPVar12[0xb].ob_refcnt = (Py_ssize_t)__dest;
  pPVar13->ob_refcnt = pPVar13->ob_refcnt + 1;
  pPVar12[0x10].ob_refcnt = (Py_ssize_t)pPVar13;
  pPVar12[2].ob_refcnt = 0x38;
  lVar10 = PyTuple_Size(local_160.m_ptr);
  hVar3.m_ptr = local_160.m_ptr;
  if (lVar10 != 0) {
    local_160.m_ptr = (PyObject *)0x0;
    pPVar12[0x15].ob_refcnt = (Py_ssize_t)hVar3.m_ptr;
  }
  pPVar12[0x12].ob_type = (PyTypeObject *)pybind11_object_init;
  pPVar12[6].ob_refcnt = (Py_ssize_t)&pPVar12[0x1b].ob_type;
  pPVar12[6].ob_type = (PyTypeObject *)(pPVar12 + 0x2f);
  pPVar12[7].ob_refcnt = (Py_ssize_t)&pPVar12[0x2d].ob_type;
  pPVar1 = pPVar12[10].ob_type;
  pPVar12[10].ob_type = (PyTypeObject *)((ulong)pPVar1 | 0x600);
  if ((rec->field_0x60 & 2) != 0) {
    pPVar12[10].ob_type = (PyTypeObject *)((ulong)pPVar1 | 0x4600);
    pPVar12[0x12].ob_refcnt = pPVar12[2].ob_refcnt;
    pPVar12[2].ob_refcnt = pPVar12[2].ob_refcnt + 8;
    pPVar12[0xb].ob_type = (PyTypeObject *)pybind11_traverse;
    pPVar12[0xc].ob_refcnt = (Py_ssize_t)pybind11_clear;
    pPVar12[0xf].ob_type = (PyTypeObject *)enable_dynamic_attributes(_heaptypeobject*)::getset;
  }
  if ((rec->field_0x60 & 4) != 0) {
    pPVar12[10].ob_refcnt = (Py_ssize_t)(pPVar12 + 0x34);
    pPVar12[0x34].ob_refcnt = (Py_ssize_t)pybind11_getbuffer;
    pPVar12[0x34].ob_type = (PyTypeObject *)pybind11_releasebuffer;
  }
  iVar4 = PyType_Ready(pPVar12);
  if (iVar4 < 0) {
    std::__cxx11::string::string(local_50,rec->name,&local_149);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
    local_d0._M_dataplus._M_p = (pointer)*plVar6;
    psVar14 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar14) {
      local_d0.field_2._M_allocated_capacity = *psVar14;
      local_d0.field_2._8_8_ = plVar6[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar14;
    }
    local_d0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    error_string_abi_cxx11_();
    std::operator+(&local_b0,&local_d0,&local_70);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_f0._M_dataplus._M_p = (pointer)*plVar6;
    psVar14 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_f0._M_dataplus._M_p == psVar14) {
      local_f0.field_2._M_allocated_capacity = *psVar14;
      local_f0.field_2._8_8_ = plVar6[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar14;
    }
    local_f0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    pybind11_fail(&local_f0);
  }
  if (((rec->field_0x60 & 2) == 0) != (((ulong)pPVar12[10].ob_type & 0x4000) == 0)) {
    __assert_fail("rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC) : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/daniellasry[P]CPPTest/pybind11/include/pybind11/detail/class.h"
                  ,0x25d,"PyObject *pybind11::detail::make_new_python_type(const type_record &)");
  }
  pPVar13 = (rec->scope).m_ptr;
  if (pPVar13 == (PyObject *)0x0) {
    pPVar12->ob_refcnt = pPVar12->ob_refcnt + 1;
  }
  else {
    iVar4 = PyObject_SetAttrString(pPVar13,rec->name,pPVar12);
    if (iVar4 != 0) {
      this = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this);
      goto LAB_00111771;
    }
  }
  if (local_158.m_ptr != (PyObject *)0x0) {
    iVar4 = PyObject_SetAttrString(pPVar12,"__module__");
    if (iVar4 != 0) {
      this = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this);
LAB_00111771:
      __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
  }
  pybind11::object::~object((object *)&local_160);
  pybind11::object::~object((object *)&local_158);
  pybind11::object::~object((object *)&local_120);
  pybind11::object::~object((object *)&local_148);
  return pPVar12;
}

Assistant:

inline PyObject* make_new_python_type(const type_record &rec) {
    auto name = reinterpret_steal<object>(PYBIND11_FROM_STRING(rec.name));

    auto qualname = name;
    if (rec.scope && !PyModule_Check(rec.scope.ptr()) && hasattr(rec.scope, "__qualname__")) {
#if PY_MAJOR_VERSION >= 3
        qualname = reinterpret_steal<object>(
            PyUnicode_FromFormat("%U.%U", rec.scope.attr("__qualname__").ptr(), name.ptr()));
#else
        qualname = str(rec.scope.attr("__qualname__").cast<std::string>() + "." + rec.name);
#endif
    }

    object module;
    if (rec.scope) {
        if (hasattr(rec.scope, "__module__"))
            module = rec.scope.attr("__module__");
        else if (hasattr(rec.scope, "__name__"))
            module = rec.scope.attr("__name__");
    }

    auto full_name = c_str(
#if !defined(PYPY_VERSION)
        module ? str(module).cast<std::string>() + "." + rec.name :
#endif
        rec.name);

    char *tp_doc = nullptr;
    if (rec.doc && options::show_user_defined_docstrings()) {
        /* Allocate memory for docstring (using PyObject_MALLOC, since
           Python will free this later on) */
        size_t size = strlen(rec.doc) + 1;
        tp_doc = (char *) PyObject_MALLOC(size);
        memcpy((void *) tp_doc, rec.doc, size);
    }

    auto &internals = get_internals();
    auto bases = tuple(rec.bases);
    auto base = (bases.size() == 0) ? internals.instance_base
                                    : bases[0].ptr();

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto metaclass = rec.metaclass.ptr() ? (PyTypeObject *) rec.metaclass.ptr()
                                         : internals.default_metaclass;

    auto heap_type = (PyHeapTypeObject *) metaclass->tp_alloc(metaclass, 0);
    if (!heap_type)
        pybind11_fail(std::string(rec.name) + ": Unable to create type object!");

    heap_type->ht_name = name.release().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = qualname.inc_ref().ptr();
#endif

    auto type = &heap_type->ht_type;
    type->tp_name = full_name;
    type->tp_doc = tp_doc;
    type->tp_base = type_incref((PyTypeObject *)base);
    type->tp_basicsize = static_cast<ssize_t>(sizeof(instance));
    if (bases.size() > 0)
        type->tp_bases = bases.release().ptr();

    /* Don't inherit base __init__ */
    type->tp_init = pybind11_object_init;

    /* Supported protocols */
    type->tp_as_number = &heap_type->as_number;
    type->tp_as_sequence = &heap_type->as_sequence;
    type->tp_as_mapping = &heap_type->as_mapping;

    /* Flags */
    type->tp_flags |= Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;
#if PY_MAJOR_VERSION < 3
    type->tp_flags |= Py_TPFLAGS_CHECKTYPES;
#endif

    if (rec.dynamic_attr)
        enable_dynamic_attributes(heap_type);

    if (rec.buffer_protocol)
        enable_buffer_protocol(heap_type);

    if (PyType_Ready(type) < 0)
        pybind11_fail(std::string(rec.name) + ": PyType_Ready failed (" + error_string() + ")!");

    assert(rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)
                            : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC));

    /* Register type with the parent scope */
    if (rec.scope)
        setattr(rec.scope, rec.name, (PyObject *) type);
    else
        Py_INCREF(type); // Keep it alive forever (reference leak)

    if (module) // Needed by pydoc
        setattr((PyObject *) type, "__module__", module);

    PYBIND11_SET_OLDPY_QUALNAME(type, qualname);

    return (PyObject *) type;
}